

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# impl.h
# Opt level: O2

Mark __thiscall YAML::Node::Mark(Node *this)

{
  element_type *peVar1;
  undefined8 uVar2;
  InvalidNode *this_00;
  int iVar3;
  Mark MVar4;
  
  if (this->m_isValid != false) {
    if (this->m_pNode == (node *)0x0) {
      iVar3 = -1;
      uVar2 = 0xffffffffffffffff;
    }
    else {
      peVar1 = (((this->m_pNode->m_pRef).
                 super___shared_ptr<YAML::detail::node_ref,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               m_pData).super___shared_ptr<YAML::detail::node_data,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      uVar2._0_4_ = (peVar1->m_mark).pos;
      uVar2._4_4_ = (peVar1->m_mark).line;
      iVar3 = *(int *)((long)&peVar1->m_mark + 8);
    }
    MVar4.column = iVar3;
    MVar4.pos = (int)uVar2;
    MVar4.line = (int)((ulong)uVar2 >> 0x20);
    return MVar4;
  }
  this_00 = (InvalidNode *)__cxa_allocate_exception(0x40);
  InvalidNode::InvalidNode(this_00,&this->m_invalidKey);
  __cxa_throw(this_00,&InvalidNode::typeinfo,BadConversion::~BadConversion);
}

Assistant:

inline Mark Node::Mark() const {
  if (!m_isValid) {
    throw InvalidNode(m_invalidKey);
  }
  return m_pNode ? m_pNode->mark() : Mark::null_mark();
}